

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall QColumnView::setResizeGripsVisible(QColumnView *this,bool visible)

{
  long lVar1;
  long lVar2;
  long lVar3;
  QWidget *parent;
  QWidget *widget;
  long lVar4;
  long in_FS_OFFSET;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  if ((bool)*(char *)(lVar1 + 0x570) != visible) {
    *(bool *)(lVar1 + 0x570) = visible;
    std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::clear
              ((vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)
               (lVar1 + 0x590));
    lVar2 = *(long *)(lVar1 + 0x548);
    lVar3 = *(long *)(lVar1 + 0x550);
    for (lVar4 = 0; lVar3 << 3 != lVar4; lVar4 = lVar4 + 8) {
      parent = *(QWidget **)(lVar2 + lVar4);
      if (visible) {
        widget = (QWidget *)operator_new(0x28);
        QColumnViewGrip::QColumnViewGrip((QColumnViewGrip *)widget,parent);
        QAbstractScrollArea::setCornerWidget((QAbstractScrollArea *)parent,widget);
        QObjectPrivate::connect<void(QColumnViewGrip::*)(int),void(QColumnViewPrivate::*)(int)>
                  ((Object *)&stack0xffffffffffffffc0,(offset_in_QColumnViewGrip_to_subr)widget,
                   (Object *)QColumnViewGrip::gripMoved,0,(ConnectionType)lVar1);
        std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::
        emplace_back<QMetaObject::Connection>
                  ((vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)
                   (lVar1 + 0x590),(Connection *)&stack0xffffffffffffffc0);
        QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc0);
      }
      else {
        QAbstractScrollArea::cornerWidget((QAbstractScrollArea *)parent);
        QAbstractScrollArea::setCornerWidget((QAbstractScrollArea *)parent,(QWidget *)0x0);
        QObject::deleteLater();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnView::setResizeGripsVisible(bool visible)
{
    Q_D(QColumnView);
    if (d->showResizeGrips == visible)
        return;
    d->showResizeGrips = visible;
    d->gripConnections.clear();
    for (QAbstractItemView *view : std::as_const(d->columns)) {
        if (visible) {
            QColumnViewGrip *grip = new QColumnViewGrip(view);
            view->setCornerWidget(grip);
            d->gripConnections.push_back(
                QObjectPrivate::connect(grip, &QColumnViewGrip::gripMoved,
                                        d, &QColumnViewPrivate::gripMoved)
            );
        } else {
            QWidget *widget = view->cornerWidget();
            view->setCornerWidget(nullptr);
            widget->deleteLater();
        }
    }
}